

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline<ImVec2>
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  uint uVar4;
  uint uVar5;
  ImVec2 IVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  long lVar9;
  ImVec2 IVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ImU32 IVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ImVec2 IVar36;
  float fVar37;
  float fVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  uint uVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_XMM5_Da;
  float in_XMM5_Db;
  float fVar49;
  float in_XMM9_Da;
  float fVar50;
  float fVar51;
  float in_XMM9_Db;
  float fVar52;
  float fVar53;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM15_Da;
  float in_XMM15_Db;
  int local_1bc;
  float local_b8;
  float fStack_b4;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  if (1 < points_count) {
    uVar24 = (ulong)(uint)points_count;
    IVar6 = this->_Data->TexUvWhitePixel;
    uVar18 = points_count - 1;
    uVar28 = (ulong)uVar18;
    if (closed) {
      uVar28 = (ulong)(uint)points_count;
    }
    uVar4 = this->Flags;
    uVar14 = col & 0xffffff;
    iVar27 = (int)uVar28;
    if (1.0 < thickness || (uVar4 & 1) == 0) {
      iVar15 = (uVar4 & 1) * 3 + 3;
      iVar1 = 9;
      if ((uVar4 & 1) != 0) {
        thickness = thickness + -1.0;
        iVar1 = 0x1b;
      }
      PrimReserve(this,iVar1 * iVar27,iVar15 * points_count);
      fVar47 = thickness * 0.5;
      fVar44 = fVar47 + 1.0;
      uVar5 = this->_VtxCurrentIdx;
      fVar32 = 0.0;
      if (closed) {
        in_XMM9_Da = (*points).x - points[uVar24 - 1].x;
        in_XMM9_Db = (*points).y - points[uVar24 - 1].y;
        fVar32 = in_XMM9_Da * in_XMM9_Da + in_XMM9_Db * in_XMM9_Db;
        if (0.0 < fVar32) {
          if (fVar32 < 0.0) {
            fVar33 = sqrtf(fVar32);
          }
          else {
            fVar33 = SQRT(fVar32);
          }
          in_XMM9_Da = in_XMM9_Da * (1.0 / fVar33);
          in_XMM9_Db = in_XMM9_Db * (1.0 / fVar33);
        }
      }
      iVar1 = (uVar4 & 1) * 2 + 2;
      uVar28 = uVar24;
      if (points_count < 2) {
        uVar28 = 1;
      }
      iVar19 = 0;
      local_1bc = 0;
      uVar25 = 0;
      do {
        uVar29 = uVar25 + 1;
        uVar12 = 0;
        if (uVar24 - 1 != uVar25) {
          uVar12 = uVar29;
        }
        fVar45 = points[uVar25].x - points[uVar12].x;
        fVar48 = points[uVar25].y - points[uVar12].y;
        fVar33 = fVar45 * fVar45 + fVar48 * fVar48;
        if (0.0 < fVar33) {
          if (fVar33 < 0.0) {
            fVar34 = sqrtf(fVar33);
          }
          else {
            fVar34 = SQRT(fVar33);
          }
          fVar45 = fVar45 * (1.0 / fVar34);
          fVar48 = fVar48 * (1.0 / fVar34);
        }
        if (uVar25 == 0 && !closed) {
          in_XMM9_Da = -fVar45;
          in_XMM9_Db = -fVar48;
          fVar32 = fVar33;
        }
        else if (uVar18 == uVar25 && !closed) {
          fVar45 = -in_XMM9_Da;
          fVar48 = -in_XMM9_Db;
          fVar33 = fVar32;
        }
        fVar53 = -in_XMM9_Db;
        fVar49 = in_XMM9_Da * fVar48 - fVar45 * in_XMM9_Db;
        fVar34 = in_XMM9_Da * fVar45 + fVar48 * in_XMM9_Db;
        if (ABS(fVar49) <= 1e-05) {
          fVar50 = points[uVar25].x;
          fVar32 = in_XMM9_Db * fVar47 + fVar50;
          fVar37 = points[uVar25].y;
          fVar35 = -in_XMM9_Da * fVar47 + fVar37;
          fVar51 = fVar53 * fVar47 + fVar50;
          fVar52 = in_XMM9_Da * fVar47 + fVar37;
          if ((uVar4 & 1) != 0) {
            local_b8 = in_XMM9_Db * fVar44 + fVar50;
            fStack_b4 = -in_XMM9_Da * fVar44 + fVar37;
            in_XMM5_Da = fVar53 * fVar44 + fVar50;
            in_XMM5_Db = in_XMM9_Da * fVar44 + fVar37;
          }
        }
        else {
          fVar50 = fVar47 / fVar49;
          if (1e-05 < fVar34) {
            fVar35 = fVar33;
            if (fVar32 <= fVar33) {
              fVar35 = fVar32;
            }
            fVar32 = ((fVar45 + in_XMM9_Da) * (fVar45 + in_XMM9_Da) +
                     (fVar48 + in_XMM9_Db) * (fVar48 + in_XMM9_Db)) * fVar50 * fVar50;
            if (fVar35 < fVar32) {
              fVar35 = fVar35 / fVar32;
              if (fVar35 < 0.0) {
                fVar35 = sqrtf(fVar35);
              }
              else {
                fVar35 = SQRT(fVar35);
              }
              fVar50 = fVar50 * fVar35;
            }
          }
          fVar38 = fVar45 + in_XMM9_Da;
          fVar41 = fVar48 + in_XMM9_Db;
          fVar37 = points[uVar25].x;
          fVar46 = points[uVar25].y;
          fVar32 = fVar37 - fVar50 * fVar38;
          fVar35 = fVar46 - fVar50 * fVar41;
          fVar51 = fVar50 * fVar38 + fVar37;
          fVar52 = fVar50 * fVar41 + fVar46;
          if ((uVar4 & 1) != 0) {
            fVar50 = fVar44 / fVar49;
            local_b8 = -fVar38 * fVar50 + fVar37;
            fStack_b4 = -fVar41 * fVar50 + fVar46;
            in_XMM5_Da = fVar50 * fVar38 + fVar37;
            in_XMM5_Db = fVar50 * fVar41 + fVar46;
          }
        }
        iVar13 = ((fVar49 < 0.0) - 1) + (uint)(fVar49 < 0.0);
        if (fVar34 <= 1e-05) {
          iVar16 = 4;
          iVar11 = 2;
        }
        else {
          fVar46 = (float)-iVar13;
          fVar38 = fVar53 * fVar46 + in_XMM9_Da;
          in_XMM9_Db = in_XMM9_Da * fVar46 + in_XMM9_Db;
          fVar50 = points[uVar25].x;
          in_XMM14_Da = fVar38 * fVar47 + fVar50;
          fVar37 = points[uVar25].y;
          in_XMM14_Db = in_XMM9_Db * fVar47 + fVar37;
          fVar49 = fVar48 * fVar46 + fVar45;
          fVar53 = -fVar45 * fVar46 + fVar48;
          in_XMM15_Da = fVar49 * fVar47 + fVar50;
          in_XMM15_Db = fVar53 * fVar47 + fVar37;
          iVar16 = 6;
          iVar11 = 3;
          if ((uVar4 & 1) != 0) {
            local_58 = fVar38 * fVar44 + fVar50;
            fStack_54 = in_XMM9_Db * fVar44 + fVar37;
            local_68 = fVar49 * fVar44 + fVar50;
            fStack_64 = fVar53 * fVar44 + fVar37;
          }
        }
        bVar30 = 1e-05 < fVar34;
        if ((uVar4 & 1) != 0) {
          iVar11 = iVar16;
        }
        bVar31 = 0 < iVar13;
        bVar20 = bVar31 && bVar30;
        bVar21 = iVar13 < 0 && bVar30;
        pIVar7 = this->_VtxWritePtr;
        uVar17 = (uint)bVar20;
        uVar39 = (int)(uVar17 << 0x1f) >> 0x1f;
        uVar42 = (int)(uVar17 << 0x1f) >> 0x1f;
        pIVar7->pos = (ImVec2)(CONCAT44(~uVar42 & (uint)fVar35,~uVar39 & (uint)fVar32) |
                              CONCAT44((uint)in_XMM14_Db & uVar42,(uint)in_XMM14_Da & uVar39));
        pIVar7->uv = IVar6;
        pIVar7 = this->_VtxWritePtr;
        pIVar7->col = col;
        uVar39 = (uint)bVar21;
        uVar42 = (uint)bVar21;
        uVar40 = (int)(uVar42 << 0x1f) >> 0x1f;
        uVar43 = (int)(uVar42 << 0x1f) >> 0x1f;
        pIVar7[1].pos =
             (ImVec2)(CONCAT44(~uVar43 & (uint)fVar52,~uVar40 & (uint)fVar51) |
                     CONCAT44((uint)in_XMM14_Db & uVar43,(uint)in_XMM14_Da & uVar40));
        pIVar7[1].uv = IVar6;
        pIVar7 = this->_VtxWritePtr;
        pIVar7[1].col = col;
        if (1e-05 < fVar34) {
          lVar9 = (ulong)(uint)(iVar1 * 4) * 5;
          *(ulong *)((long)&(pIVar7->pos).x + lVar9) = CONCAT44(in_XMM15_Db,in_XMM15_Da);
          *(ImVec2 *)((long)&(pIVar7->uv).x + lVar9) = IVar6;
          *(ImU32 *)((long)&this->_VtxWritePtr->col + lVar9) = col;
        }
        if ((uVar4 & 1) != 0) {
          uVar12 = CONCAT44((int)(uVar17 << 0x1f) >> 0x1f,(int)(uVar17 << 0x1f) >> 0x1f);
          pIVar7 = this->_VtxWritePtr;
          pIVar7[2].pos =
               (ImVec2)(~uVar12 & CONCAT44(fStack_b4,local_b8) |
                       CONCAT44(fStack_54,local_58) & uVar12);
          pIVar7[2].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[2].col = uVar14;
          uVar12 = CONCAT44((int)(uVar42 << 0x1f) >> 0x1f,(int)(uVar42 << 0x1f) >> 0x1f);
          pIVar7[3].pos =
               (ImVec2)(~uVar12 & CONCAT44(in_XMM5_Db,in_XMM5_Da) |
                       CONCAT44(fStack_54,local_58) & uVar12);
          pIVar7[3].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[3].col = uVar14;
          if (1e-05 < fVar34) {
            IVar10.y = fStack_64;
            IVar10.x = local_68;
            pIVar7[5].pos = IVar10;
            pIVar7[5].uv = IVar6;
            this->_VtxWritePtr[5].col = uVar14;
          }
        }
        this->_VtxWritePtr =
             (ImDrawVert *)((long)&(this->_VtxWritePtr->pos).x + (ulong)(uint)(iVar11 * 0x14));
        if ((long)uVar25 < (long)iVar27) {
          uVar17 = this->_VtxCurrentIdx;
          uVar40 = uVar17 + iVar11;
          if ((long)(int)uVar18 <= (long)uVar25) {
            uVar40 = uVar5;
          }
          iVar16 = 0;
          if (bVar31 && bVar30) {
            iVar16 = iVar1;
          }
          uVar43 = iVar16 + uVar17;
          iVar16 = 1;
          if (iVar13 < 0 && bVar30) {
            iVar16 = iVar1;
          }
          uVar22 = iVar16 + uVar17;
          uVar23 = uVar40 + 1;
          puVar8 = this->_IdxWritePtr;
          *puVar8 = uVar43;
          puVar8[1] = uVar22;
          puVar8[2] = uVar23;
          puVar8[3] = uVar43;
          puVar8[4] = uVar23;
          puVar8[5] = uVar40;
          this->_IdxWritePtr = puVar8 + 6;
          if (fVar34 <= 1e-05) {
            local_1bc = local_1bc + 3;
          }
          else {
            puVar8[6] = uVar43;
            puVar8[7] = uVar22;
            puVar8[8] = uVar17 + (!bVar31 || !bVar30);
            this->_IdxWritePtr = puVar8 + 9;
          }
          if ((uVar4 & 1) != 0) {
            puVar8 = this->_IdxWritePtr;
            uVar17 = this->_VtxCurrentIdx + 2 + (uint)bVar20 + (uint)bVar20 * 2;
            uVar2 = this->_VtxCurrentIdx + 3 + uVar39 * 2;
            *puVar8 = uVar17;
            puVar8[1] = uVar43;
            puVar8[2] = uVar40;
            puVar8[3] = uVar17;
            puVar8[4] = uVar40;
            puVar8[5] = uVar40 + 2;
            puVar8[6] = uVar2;
            puVar8[7] = uVar22;
            puVar8[8] = uVar23;
            puVar8[9] = uVar2;
            puVar8[10] = uVar23;
            puVar8[0xb] = uVar40 + 3;
            this->_IdxWritePtr = puVar8 + 0xc;
            if (fVar34 <= 1e-05) {
              local_1bc = local_1bc + 6;
            }
            else {
              puVar8[0xc] = this->_VtxCurrentIdx + (2 - uVar42);
              puVar8[0xd] = uVar39 * 3 + this->_VtxCurrentIdx;
              puVar8[0xe] = this->_VtxCurrentIdx + uVar39 + 4;
              puVar8[0xf] = (2 - uVar42) + this->_VtxCurrentIdx;
              puVar8[0x10] = uVar39 + 4 + this->_VtxCurrentIdx;
              puVar8[0x11] = (uVar39 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar8 + 0x12;
            }
          }
        }
        in_XMM9_Da = -fVar45;
        in_XMM9_Db = -fVar48;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar11;
        iVar19 = (iVar19 + iVar15) - iVar11;
        uVar25 = uVar29;
        fVar32 = fVar33;
      } while (uVar28 != uVar29);
      pIVar3 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
      pIVar3->ElemCount = pIVar3->ElemCount - local_1bc;
      (this->VtxBuffer).Size = (this->VtxBuffer).Size - iVar19;
      (this->IdxBuffer).Size = (this->IdxBuffer).Size - local_1bc;
    }
    else {
      PrimReserve(this,iVar27 * 0xc,iVar27 * 6);
      if (0 < iVar27) {
        IVar26 = (int)((float)(col >> 0x18) * thickness) * 0x1000000 + uVar14;
        uVar25 = 1;
        do {
          uVar29 = uVar25;
          if (uVar24 == uVar25) {
            uVar29 = 0;
          }
          fVar44 = points[uVar29].x - points[uVar25 - 1].x;
          fVar47 = points[uVar29].y - points[uVar25 - 1].y;
          fVar32 = fVar44 * fVar44 + fVar47 * fVar47;
          if (0.0 < fVar32) {
            if (fVar32 < 0.0) {
              fVar32 = sqrtf(fVar32);
            }
            else {
              fVar32 = SQRT(fVar32);
            }
            fVar44 = fVar44 * (1.0 / fVar32);
            fVar47 = fVar47 * (1.0 / fVar32);
          }
          pIVar7 = this->_VtxWritePtr;
          IVar36.y = points[uVar25 - 1].y - fVar44;
          IVar36.x = points[uVar25 - 1].x + fVar47;
          pIVar7->pos = IVar36;
          pIVar7->uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7->col = uVar14;
          pIVar7[1].pos = points[uVar25 - 1];
          pIVar7[1].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[1].col = IVar26;
          pIVar7[2].pos.x = points[uVar25 - 1].x - fVar47;
          pIVar7[2].pos.y = points[uVar25 - 1].y + fVar44;
          pIVar7[2].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[2].col = uVar14;
          pIVar7[3].pos.x = points[uVar29].x + fVar47;
          pIVar7[3].pos.y = points[uVar29].y - fVar44;
          pIVar7[3].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[3].col = uVar14;
          pIVar7[4].pos = points[uVar29];
          pIVar7[4].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[4].col = IVar26;
          pIVar7[5].pos.x = points[uVar29].x - fVar47;
          pIVar7[5].pos.y = points[uVar29].y + fVar44;
          pIVar7[5].uv = IVar6;
          pIVar7 = this->_VtxWritePtr;
          pIVar7[5].col = uVar14;
          this->_VtxWritePtr = pIVar7 + 6;
          puVar8 = this->_IdxWritePtr;
          *puVar8 = this->_VtxCurrentIdx;
          puVar8[1] = this->_VtxCurrentIdx + 1;
          puVar8[2] = this->_VtxCurrentIdx + 4;
          puVar8[3] = this->_VtxCurrentIdx;
          puVar8[4] = this->_VtxCurrentIdx + 4;
          puVar8[5] = this->_VtxCurrentIdx + 3;
          puVar8[6] = this->_VtxCurrentIdx + 1;
          puVar8[7] = this->_VtxCurrentIdx + 2;
          puVar8[8] = this->_VtxCurrentIdx + 5;
          puVar8[9] = this->_VtxCurrentIdx + 1;
          puVar8[10] = this->_VtxCurrentIdx + 5;
          puVar8[0xb] = this->_VtxCurrentIdx + 4;
          this->_IdxWritePtr = puVar8 + 0xc;
          this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
          bVar30 = uVar25 != uVar28;
          uVar25 = uVar25 + 1;
        } while (bVar30);
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}